

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O0

void __thiscall CLayerTiles::Render(CLayerTiles *this)

{
  int iVar1;
  int iVar2;
  CEditorImage **ppCVar3;
  IGraphics *pIVar4;
  long in_RDI;
  long in_FS_OFFSET;
  vec4 in_stack_00000000;
  void *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_00000060;
  vec4 Color;
  ENVELOPE_EVAL in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffe4;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_ffffffffffffffe8;
  anon_union_4_2_94730039_for_vector4_base<float>_5 in_stack_ffffffffffffffec;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_stack_fffffffffffffff0;
  uint uVar5;
  CRenderTools *this_00;
  
  this_00 = *(CRenderTools **)(in_FS_OFFSET + 0x28);
  if (-1 < *(int *)(in_RDI + 0x30)) {
    iVar1 = *(int *)(in_RDI + 0x30);
    iVar2 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                      ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                       (*(long *)(in_RDI + 8) + 0x1260));
    if (iVar1 < iVar2) {
      ppCVar3 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                          ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                           (*(long *)(in_RDI + 8) + 0x1260),*(int *)(in_RDI + 0x30));
      *(int *)(in_RDI + 0x28) = ((*ppCVar3)->m_Texture).m_Id;
    }
  }
  pIVar4 = CLayer::Graphics((CLayer *)0x20ebb2);
  uVar5 = *(uint *)(in_RDI + 0x28);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])(pIVar4,(ulong)uVar5);
  vector4_base<float>::vector4_base
            ((vector4_base<float> *)&stack0xffffffffffffffe4,(float)*(int *)(in_RDI + 0x3c) / 255.0,
             (float)*(int *)(in_RDI + 0x40) / 255.0,(float)*(int *)(in_RDI + 0x44) / 255.0,
             (float)*(int *)(in_RDI + 0x48) / 255.0);
  pIVar4 = CLayer::Graphics((CLayer *)0x20ec16);
  (*(pIVar4->super_IInterface)._vptr_IInterface[7])();
  CEditor::RenderTools(*(CEditor **)(in_RDI + 8));
  CRenderTools::RenderTilemap
            (this_00,(CTile *)CONCAT44(uVar5,in_stack_fffffffffffffff0),
             (int)in_stack_ffffffffffffffec,(int)in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4.x,in_stack_00000000,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  pIVar4 = CLayer::Graphics((CLayer *)0x20eca1);
  (*(pIVar4->super_IInterface)._vptr_IInterface[8])();
  CEditor::RenderTools(*(CEditor **)(in_RDI + 8));
  CRenderTools::RenderTilemap
            (this_00,(CTile *)CONCAT44(uVar5,in_stack_fffffffffffffff0),
             (int)in_stack_ffffffffffffffec,(int)in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4.x,in_stack_00000000,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  if (*(CRenderTools **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerTiles::Render()
{
	if(m_Image >= 0 && m_Image < m_pEditor->m_Map.m_lImages.size())
		m_Texture = m_pEditor->m_Map.m_lImages[m_Image]->m_Texture;
	Graphics()->TextureSet(m_Texture);
	vec4 Color = vec4(m_Color.r/255.0f, m_Color.g/255.0f, m_Color.b/255.0f, m_Color.a/255.0f);
	Graphics()->BlendNone();
	m_pEditor->RenderTools()->RenderTilemap(m_pTiles, m_Width, m_Height, 32.0f, Color, LAYERRENDERFLAG_OPAQUE,
												m_pEditor->EnvelopeEval, m_pEditor, m_ColorEnv, m_ColorEnvOffset);
	Graphics()->BlendNormal();
	m_pEditor->RenderTools()->RenderTilemap(m_pTiles, m_Width, m_Height, 32.0f, Color, LAYERRENDERFLAG_TRANSPARENT,
												m_pEditor->EnvelopeEval, m_pEditor, m_ColorEnv, m_ColorEnvOffset);
}